

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O0

void load_GL_EXT_framebuffer_object(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_framebuffer_object != 0) {
    glad_glIsRenderbufferEXT = (PFNGLISRENDERBUFFEREXTPROC)(*load)("glIsRenderbufferEXT");
    glad_glBindRenderbufferEXT = (PFNGLBINDRENDERBUFFEREXTPROC)(*load)("glBindRenderbufferEXT");
    glad_glDeleteRenderbuffersEXT =
         (PFNGLDELETERENDERBUFFERSEXTPROC)(*load)("glDeleteRenderbuffersEXT");
    glad_glGenRenderbuffersEXT = (PFNGLGENRENDERBUFFERSEXTPROC)(*load)("glGenRenderbuffersEXT");
    glad_glRenderbufferStorageEXT =
         (PFNGLRENDERBUFFERSTORAGEEXTPROC)(*load)("glRenderbufferStorageEXT");
    glad_glGetRenderbufferParameterivEXT =
         (PFNGLGETRENDERBUFFERPARAMETERIVEXTPROC)(*load)("glGetRenderbufferParameterivEXT");
    glad_glIsFramebufferEXT = (PFNGLISFRAMEBUFFEREXTPROC)(*load)("glIsFramebufferEXT");
    glad_glBindFramebufferEXT = (PFNGLBINDFRAMEBUFFEREXTPROC)(*load)("glBindFramebufferEXT");
    glad_glDeleteFramebuffersEXT =
         (PFNGLDELETEFRAMEBUFFERSEXTPROC)(*load)("glDeleteFramebuffersEXT");
    glad_glGenFramebuffersEXT = (PFNGLGENFRAMEBUFFERSEXTPROC)(*load)("glGenFramebuffersEXT");
    glad_glCheckFramebufferStatusEXT =
         (PFNGLCHECKFRAMEBUFFERSTATUSEXTPROC)(*load)("glCheckFramebufferStatusEXT");
    glad_glFramebufferTexture1DEXT =
         (PFNGLFRAMEBUFFERTEXTURE1DEXTPROC)(*load)("glFramebufferTexture1DEXT");
    glad_glFramebufferTexture2DEXT =
         (PFNGLFRAMEBUFFERTEXTURE2DEXTPROC)(*load)("glFramebufferTexture2DEXT");
    glad_glFramebufferTexture3DEXT =
         (PFNGLFRAMEBUFFERTEXTURE3DEXTPROC)(*load)("glFramebufferTexture3DEXT");
    glad_glFramebufferRenderbufferEXT =
         (PFNGLFRAMEBUFFERRENDERBUFFEREXTPROC)(*load)("glFramebufferRenderbufferEXT");
    glad_glGetFramebufferAttachmentParameterivEXT =
         (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVEXTPROC)
         (*load)("glGetFramebufferAttachmentParameterivEXT");
    glad_glGenerateMipmapEXT = (PFNGLGENERATEMIPMAPEXTPROC)(*load)("glGenerateMipmapEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_framebuffer_object(GLADloadproc load) {
	if(!GLAD_GL_EXT_framebuffer_object) return;
	glad_glIsRenderbufferEXT = (PFNGLISRENDERBUFFEREXTPROC)load("glIsRenderbufferEXT");
	glad_glBindRenderbufferEXT = (PFNGLBINDRENDERBUFFEREXTPROC)load("glBindRenderbufferEXT");
	glad_glDeleteRenderbuffersEXT = (PFNGLDELETERENDERBUFFERSEXTPROC)load("glDeleteRenderbuffersEXT");
	glad_glGenRenderbuffersEXT = (PFNGLGENRENDERBUFFERSEXTPROC)load("glGenRenderbuffersEXT");
	glad_glRenderbufferStorageEXT = (PFNGLRENDERBUFFERSTORAGEEXTPROC)load("glRenderbufferStorageEXT");
	glad_glGetRenderbufferParameterivEXT = (PFNGLGETRENDERBUFFERPARAMETERIVEXTPROC)load("glGetRenderbufferParameterivEXT");
	glad_glIsFramebufferEXT = (PFNGLISFRAMEBUFFEREXTPROC)load("glIsFramebufferEXT");
	glad_glBindFramebufferEXT = (PFNGLBINDFRAMEBUFFEREXTPROC)load("glBindFramebufferEXT");
	glad_glDeleteFramebuffersEXT = (PFNGLDELETEFRAMEBUFFERSEXTPROC)load("glDeleteFramebuffersEXT");
	glad_glGenFramebuffersEXT = (PFNGLGENFRAMEBUFFERSEXTPROC)load("glGenFramebuffersEXT");
	glad_glCheckFramebufferStatusEXT = (PFNGLCHECKFRAMEBUFFERSTATUSEXTPROC)load("glCheckFramebufferStatusEXT");
	glad_glFramebufferTexture1DEXT = (PFNGLFRAMEBUFFERTEXTURE1DEXTPROC)load("glFramebufferTexture1DEXT");
	glad_glFramebufferTexture2DEXT = (PFNGLFRAMEBUFFERTEXTURE2DEXTPROC)load("glFramebufferTexture2DEXT");
	glad_glFramebufferTexture3DEXT = (PFNGLFRAMEBUFFERTEXTURE3DEXTPROC)load("glFramebufferTexture3DEXT");
	glad_glFramebufferRenderbufferEXT = (PFNGLFRAMEBUFFERRENDERBUFFEREXTPROC)load("glFramebufferRenderbufferEXT");
	glad_glGetFramebufferAttachmentParameterivEXT = (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVEXTPROC)load("glGetFramebufferAttachmentParameterivEXT");
	glad_glGenerateMipmapEXT = (PFNGLGENERATEMIPMAPEXTPROC)load("glGenerateMipmapEXT");
}